

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint min_new_capacity;
  color_quad_u8 (*pacVar5) [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int c;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  int t;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uchar uVar16;
  uchar uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  color_cluster *pcVar22;
  bool bVar23;
  float fVar24;
  color_quad_u8 endpoint;
  vector<unsigned_char> selectors;
  params params;
  int scan [3];
  results results;
  int refine [4];
  etc1_optimizer optimizer;
  undefined4 local_22c;
  elemental_vector local_228;
  dxt_hc *local_218;
  undefined4 local_210;
  undefined2 local_20c;
  uint local_208;
  color_quad<unsigned_char,_int> *local_200;
  undefined1 local_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  unsigned_long_long *local_1c8;
  uchar *local_1c0;
  float *local_1b8;
  uint *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  undefined8 local_180;
  undefined4 local_178;
  ulong local_170;
  byte abStack_168 [4];
  uint local_164;
  uint local_160;
  void *local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  etc1_optimizer local_138;
  
  local_1d8 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  local_180 = 0xffffffff;
  local_178 = 1;
  local_148 = 0xfffffffd;
  uStack_144 = 0xfffffffe;
  uStack_140 = 2;
  uStack_13c = 3;
  uVar9 = (ulong)(this->m_color_clusters).m_size;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1d8;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar9 * data;
  local_1d8 = ((data + 1) * uVar9) / local_1d8;
  if (SUB164(auVar7 / auVar6,0) < (uint)local_1d8) {
    uVar9 = SUB168(auVar7 / auVar6,0) & 0xffffffff;
    local_1d8 = local_1d8 & 0xffffffff;
    local_218 = this;
    do {
      pcVar22 = (local_218->m_color_clusters).m_p;
      if (pcVar22[uVar9].pixels.m_size != 0) {
        pcVar22 = pcVar22 + uVar9;
        local_138.m_sorted_luma[1].m_p = (uint *)0x0;
        local_138.m_sorted_luma[1].m_size = 0;
        local_138.m_sorted_luma[1].m_capacity = 0;
        local_138.m_sorted_luma[0].m_p = (uint *)0x0;
        local_138.m_sorted_luma[0].m_size = 0;
        local_138.m_sorted_luma[0].m_capacity = 0;
        local_138.m_luma.m_p = (unsigned_short *)0x0;
        local_138.m_luma.m_size = 0;
        local_138.m_luma.m_capacity = 0;
        local_138.m_best_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_best_solution.m_selectors.m_size = 0;
        local_138.m_best_solution.m_selectors.m_capacity = 0;
        local_138.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
        local_138.m_best_solution.m_coords._1_8_ = 0;
        local_138.m_best_selectors.m_p = (uchar *)0x0;
        local_138.m_best_selectors.m_size._0_1_ = 0;
        local_138.m_best_selectors._9_7_ = 0;
        local_138.m_selectors.m_p = (uchar *)0x0;
        local_138.m_selectors.m_size = 0;
        local_138.m_selectors.m_capacity = 0;
        local_138.m_best_solution.m_error = 0xffffffffffffffff;
        local_138.m_best_solution.m_valid = false;
        local_138.m_trial_solution.m_coords.m_color4 = false;
        local_138.m_trial_solution.m_coords.m_unscaled_color.field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        local_138.m_trial_solution.m_coords.m_inten_table = 0;
        local_138.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_trial_solution.m_selectors.m_size = 0;
        local_138.m_trial_solution.m_selectors.m_capacity = 0;
        local_138.m_trial_solution.m_error = 0xffffffffffffffff;
        local_138.m_trial_solution.m_valid = false;
        local_138.m_temp_selectors.m_p = (uchar *)0x0;
        local_138.m_temp_selectors.m_size = 0;
        local_138.m_temp_selectors.m_capacity = 0;
        local_138.m_pParams = (params *)0x0;
        local_138.m_pResult = (results *)0x0;
        local_138.m_pSorted_luma_indices = (uint32 *)0x0;
        local_138.m_pSorted_luma = (uint32 *)0x0;
        local_210 = 2;
        local_20c = 1;
        local_208 = 0;
        local_200 = (color_quad<unsigned_char,_int> *)0x0;
        local_1f8 = 0;
        local_1f0 = (undefined8 *)
                    &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
        local_1e8 = 1;
        local_1e0 = 0;
        min_new_capacity = (pcVar22->pixels).m_size;
        local_228.m_p = (void *)0x0;
        local_228.m_size = 0;
        local_228.m_capacity = 0;
        if (min_new_capacity != 0) {
          elemental_vector::increase_capacity
                    (&local_228,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
          memset((void *)((local_228._8_8_ & 0xffffffff) + (long)local_228.m_p),0,
                 (ulong)(min_new_capacity - local_228.m_size));
          local_228.m_size = min_new_capacity;
        }
        local_200 = (pcVar22->pixels).m_p;
        local_158 = local_228.m_p;
        local_208 = (pcVar22->pixels).m_size;
        local_160 = local_208;
        etc1_optimizer::init(&local_138,(EVP_PKEY_CTX *)&local_210);
        local_1f0 = &local_180;
        local_1e8._0_4_ = 3;
        etc1_optimizer::compute(&local_138);
        if (local_208 * 0x177 < local_170) {
          local_1f0 = (undefined8 *)&local_148;
          local_1e8._0_4_ = 4;
          etc1_optimizer::compute(&local_138);
        }
        lVar8 = 0;
        do {
          *(byte *)((long)&local_22c + lVar8) = abStack_168[lVar8] >> 2 | abStack_168[lVar8] * '\b';
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_22c = CONCAT13((char)local_164,(undefined3)local_22c);
        pcVar22->first_endpoint = local_22c;
        bVar10 = (&DAT_001ac0f0)[(ulong)(local_164 & 0xff) * 2];
        bVar1 = (&DAT_001ac0f1)[(ulong)(local_164 & 0xff) * 2];
        lVar8 = 0;
        do {
          bVar2 = *(byte *)((long)&local_22c + lVar8);
          uVar17 = bVar2 - bVar1;
          if (bVar2 < bVar1) {
            uVar17 = '\0';
          }
          pcVar22->color_values[0].field_0.c[lVar8] = uVar17;
          uVar17 = bVar2 - bVar10;
          if (bVar2 < bVar10) {
            uVar17 = '\0';
          }
          pcVar22->color_values[1].field_0.c[lVar8] = uVar17;
          uVar17 = bVar10 + bVar2;
          if (CARRY1(bVar10,bVar2)) {
            uVar17 = 0xff;
          }
          uVar16 = bVar2 + bVar1;
          if (CARRY1(bVar2,bVar1)) {
            uVar16 = 0xff;
          }
          pcVar22->color_values[2].field_0.c[lVar8] = uVar17;
          pcVar22->color_values[3].field_0.c[lVar8] = uVar16;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = 4;
        lVar12 = 0;
        do {
          pcVar22->color_values[lVar12].field_0.field_0.a = 0xff;
          lVar12 = lVar12 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        fVar24 = (float)(int)(((uint)pcVar22->color_values[3].field_0.field_0.b * 0x1d2f + 0x8000 +
                               (uint)pcVar22->color_values[3].field_0.field_0.g * 0x9646 +
                               (uint)pcVar22->color_values[3].field_0.field_0.r * 0x4c8b >> 0x10) -
                             ((uint)pcVar22->color_values[0].field_0.field_0.b * 0x1d2f + 0x8000 +
                              (uint)pcVar22->color_values[0].field_0.field_0.g * 0x9646 +
                              (uint)pcVar22->color_values[0].field_0.field_0.r * 0x4c8b >> 0x10)) /
                 100.0;
        if (1.0 <= fVar24) {
          fVar24 = 1.0;
        }
        local_1d0 = uVar9;
        fVar24 = powf(fVar24,2.7);
        local_1a8 = (ulong)pcVar22->blocks[0].m_size;
        if (local_1a8 != 0) {
          bVar3 = local_218->m_has_subblocks;
          local_1b0 = pcVar22->blocks[0].m_p;
          local_1b8 = (local_218->m_block_weights).m_p;
          local_1c0 = (local_218->m_block_encodings).m_p;
          bVar4 = (local_218->m_params).m_perceptual;
          local_1c8 = local_218->m_block_selectors[0].m_p;
          uVar9 = 0;
          do {
            local_188 = uVar9;
            local_190 = (ulong)local_1b0[local_188];
            lVar8 = local_190 << (6U - bVar3 & 0x3f);
            pacVar5 = local_218->m_blocks;
            local_1a0 = (ulong)(local_1b8[local_190] * fVar24 * 32768.0 *
                               *(float *)(&DAT_001ac140 + (ulong)(local_1c0[local_190] == '\0') * 4)
                               );
            local_198 = 0xffff;
            if ((uint)local_1a0 < 0xffff) {
              local_198 = local_1a0 & 0xffffffff;
            }
            lVar12 = 0;
            uVar20 = 0;
            do {
              uVar18 = 0xffffffff;
              uVar9 = 0;
              uVar19 = 0;
              do {
                iVar11 = (uint)(*pacVar5)[lVar12].field_0.c[lVar8] -
                         (uint)pcVar22->color_values[uVar9].field_0.field_0.r;
                uVar14 = (uint)pcVar22->color_values[uVar9].field_0.field_0.g;
                uVar21 = (uint)pcVar22->color_values[uVar9].field_0.field_0.b;
                if (bVar4 == false) {
                  iVar15 = (*pacVar5)[lVar12].field_0.c[lVar8 + 1] - uVar14;
                  iVar13 = (*pacVar5)[lVar12].field_0.c[lVar8 + 2] - uVar21;
                  uVar14 = iVar13 * iVar13 + iVar15 * iVar15 + iVar11 * iVar11;
                }
                else {
                  iVar15 = (*pacVar5)[lVar12].field_0.c[lVar8 + 1] - uVar14;
                  iVar13 = (*pacVar5)[lVar12].field_0.c[lVar8 + 2] - uVar21;
                  uVar14 = iVar13 * iVar13 + iVar15 * iVar15 * 0x19 + iVar11 * iVar11 * 8;
                }
                bVar23 = uVar14 < uVar18;
                if (bVar23) {
                  uVar18 = uVar14;
                }
                uVar19 = uVar19 & 0xff;
                if (bVar23) {
                  uVar19 = uVar9 & 0xffffffff;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != 4);
              uVar20 = (uint)uVar19 & 0xff | uVar20 << 2;
              lVar12 = lVar12 + 1;
            } while (lVar12 != (ulong)(bVar3 ^ 1) * 8 + 8);
            uVar9 = local_198;
            if ((uint)local_1a0 == 0) {
              uVar9 = 1;
            }
            bVar10 = bVar3 << 4 | 0x20;
            if ((local_1b0[local_188] & 1) != 0) {
              bVar10 = 0x20;
            }
            local_1c8[local_190] = uVar9 | (ulong)uVar20 << (bVar10 & 0x3f);
            uVar9 = local_188 + 1;
          } while (local_188 + 1 != local_1a8);
        }
        if (local_228.m_p != (void *)0x0) {
          crnlib_free(local_228.m_p);
        }
        etc1_optimizer::~etc1_optimizer(&local_138);
        uVar9 = local_1d0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_1d8);
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint8 delta[8][2] = { { 2, 8 }, { 5, 17 }, { 9, 29 }, { 13, 42 }, { 18, 60 }, { 24, 80 }, { 33, 106 }, { 47, 183 } };
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };
        for (uint iCluster = m_color_clusters.size() * data / num_tasks, iEnd = m_color_clusters.size() * (data + 1) / num_tasks; iCluster < iEnd; iCluster++)
        {
            color_cluster& cluster = m_color_clusters[iCluster];
            if (cluster.pixels.size())
            {
                etc1_optimizer optimizer;
                etc1_optimizer::params params;
                params.m_use_color4 = false;
                params.m_constrain_against_base_color5 = false;
                etc1_optimizer::results results;
                crnlib::vector<uint8> selectors(cluster.pixels.size());
                params.m_pSrc_pixels = cluster.pixels.get_ptr();
                results.m_pSelectors = selectors.get_ptr();
                results.m_n = params.m_num_src_pixels = cluster.pixels.size();
                optimizer.init(params, results);
                params.m_pScan_deltas = scan;
                params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                optimizer.compute();
                if (results.m_error > 375 * params.m_num_src_pixels)
                {
                    params.m_pScan_deltas = refine;
                    params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                    optimizer.compute();
                }
                color_quad_u8 endpoint;
                for (int c = 0; c < 3; c++)
                {
                    endpoint.c[c] = results.m_block_color_unscaled.c[c] << 3 | results.m_block_color_unscaled.c[c] >> 2;
                }
                endpoint.c[3] = results.m_block_inten_table;
                cluster.first_endpoint = endpoint.m_u32;
                for (uint8 d0 = delta[endpoint.c[3]][0], d1 = delta[endpoint.c[3]][1], c = 0; c < 3; c++)
                {
                    uint8 q = endpoint.c[c];
                    cluster.color_values[0].c[c] = q <= d1 ? 0 : q - d1;
                    cluster.color_values[1].c[c] = q <= d0 ? 0 : q - d0;
                    cluster.color_values[2].c[c] = q >= 255 - d0 ? 255 : q + d0;
                    cluster.color_values[3].c[c] = q >= 255 - d1 ? 255 : q + d1;
                }
                for (int t = 0; t < 4; t++)
                {
                    cluster.color_values[t].c[3] = 0xFF;
                }
                float endpoint_weight = powf(math::minimum((cluster.color_values[3].get_luma() - cluster.color_values[0].get_luma()) / 100.0f, 1.0f), 2.7f);

                crnlib::vector<uint>& blocks = cluster.blocks[cColor];
                uint blockSize = m_has_subblocks ? 8 : 16;
                for (uint i = 0; i < blocks.size(); i++)
                {
                    uint b = blocks[i];
                    color_quad_u8* pixels = m_has_subblocks ? ((color_quad_u8(*)[8])m_blocks)[b] : m_blocks[b];
                    uint weight = (uint)(math::clamp<uint>(0x8000 * endpoint_weight * m_block_weights[b] * (m_block_encodings[b] ? 0.972f : 1.0f), 1, 0xFFFF));
                    uint32 selector = 0;
                    for (uint p = 0; p < blockSize; p++)
                    {
                        uint error_best = cUINT32_MAX;
                        uint8 s_best = 0;
                        for (uint8 s = 0; s < 4; s++)
                        {
                            uint error = color::color_distance(m_params.m_perceptual, pixels[p], cluster.color_values[s], false);
                            if (error < error_best)
                            {
                                s_best = s;
                                error_best = error;
                            }
                        }
                        selector = selector << 2 | s_best;
                    }
                    m_block_selectors[cColor][b] = (uint64)selector << (!m_has_subblocks || (b & 1) ? 32 : 48) | weight;
                }
            }
        }
    }